

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O3

void ugui_graphics_draw_sprite(ugui_graphics_t *graphics,ugui_sprite_t sprite,ugui_point_t point)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 local_48 [8];
  ugui_sprite_t sprite_local;
  ugui_pixel_t pixel;
  
  sprite_local._0_8_ = sprite.data;
  uVar4 = sprite._0_8_;
  uVar1 = sprite._0_4_ >> 0x10;
  if (uVar1 != 0) {
    uVar2 = 0;
    local_48 = (undefined1  [8])uVar4;
    do {
      uVar3 = 0;
      if ((short)uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        do {
          _ugui_sprite_get_pixel
                    ((ugui_sprite_t *)local_48,(uint16_t)uVar3,(uint16_t)uVar2,
                     (ugui_pixel_t *)((long)&sprite_local.data + 7));
          if (sprite_local.data._7_1_ == '\x01') {
            plot(graphics,((uint)point & 0xffff) + uVar3,uVar2 + ((uint)point >> 0x10));
          }
          uVar3 = uVar3 + 1;
          uVar4 = (ulong)local_48 & 0xffff;
        } while (uVar3 < (ushort)local_48._0_2_);
        uVar1 = (uint)(ushort)local_48._2_2_;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void ugui_graphics_draw_sprite(ugui_graphics_t* graphics, ugui_sprite_t sprite, ugui_point_t point)
{
	for (int y = 0; y < sprite.h; y++) {
		for (int x = 0; x < sprite.w; x++) {
			ugui_pixel_t pixel;
			_ugui_sprite_get_pixel(&sprite, x, y, &pixel);
			if (pixel) {
				plot(graphics, point.x + x, point.y + y);
			}
		}
	}
}